

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_stats_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  undefined1 (*pauVar1) [16];
  ushort *puVar2;
  undefined8 *puVar3;
  short *psVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  parasail_result_t *ppVar18;
  __m128i *palVar19;
  __m128i *ptr;
  __m128i *b;
  __m128i *palVar20;
  __m128i *b_00;
  __m128i *ptr_00;
  __m128i *b_01;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  int16_t *ptr_03;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  long lVar24;
  undefined2 uVar25;
  int iVar26;
  int16_t iVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  __m128i *ptr_04;
  ulong uVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  __m128i *ptr_05;
  long lVar37;
  uint uVar38;
  ulong uVar39;
  bool bVar40;
  undefined4 uVar42;
  undefined1 auVar44 [16];
  undefined4 uVar43;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  ulong uVar55;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  ulong uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  ushort uVar67;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  short sVar86;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  ushort uVar98;
  undefined1 auVar97 [16];
  short sVar99;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  undefined1 auVar100 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  short sVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i_16_t e;
  __m128i_16_t h;
  uint local_220;
  __m128i *local_1f0;
  __m128i *local_1e8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  short local_128;
  short sStack_126;
  short local_118;
  short sStack_116;
  ushort local_c8;
  ushort uStack_c6;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  size_t len;
  longlong extraout_RDX_00;
  short sVar41;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar56;
  short sVar57;
  short sVar58;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_striped_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar5 = (profile->profile16).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sg_flags_stats_striped_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_striped_profile_sse41_128_16_cold_6();
      }
      else {
        uVar16 = profile->s1Len;
        if ((int)uVar16 < 1) {
          parasail_sg_flags_stats_striped_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_striped_profile_sse41_128_16_cold_4();
        }
        else {
          uVar32 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_stats_striped_profile_sse41_128_16_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_stats_striped_profile_sse41_128_16_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_stats_striped_profile_sse41_128_16_cold_1();
          }
          else {
            iVar26 = uVar16 - 1;
            uVar39 = (ulong)uVar16 + 7 >> 3;
            uVar38 = (uint)uVar39;
            iVar13 = iVar26 / (int)uVar38;
            uVar22 = iVar26 % (int)uVar38;
            pvVar7 = (profile->profile16).matches;
            pvVar8 = (profile->profile16).similar;
            uVar28 = -open;
            uVar23 = ppVar6->min;
            iVar36 = -uVar23;
            if (uVar23 != uVar28 && SBORROW4(uVar23,uVar28) == (int)(uVar23 + open) < 0) {
              iVar36 = open;
            }
            iVar17 = ppVar6->max;
            ppVar18 = parasail_result_new_stats();
            if (ppVar18 != (parasail_result_t *)0x0) {
              ppVar18->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar18->flag | 0x8210802;
              palVar19 = parasail_memalign___m128i(0x10,uVar39);
              ptr = parasail_memalign___m128i(0x10,uVar39);
              b = parasail_memalign___m128i(0x10,uVar39);
              palVar20 = parasail_memalign___m128i(0x10,uVar39);
              b_00 = parasail_memalign___m128i(0x10,uVar39);
              ptr_00 = parasail_memalign___m128i(0x10,uVar39);
              b_01 = parasail_memalign___m128i(0x10,uVar39);
              ptr_01 = parasail_memalign___m128i(0x10,uVar39);
              ptr_02 = parasail_memalign___m128i(0x10,uVar39);
              b_02 = parasail_memalign___m128i(0x10,uVar39);
              b_03 = parasail_memalign___m128i(0x10,uVar39);
              b_04 = parasail_memalign___m128i(0x10,uVar39);
              ptr_03 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = (b_03 == (__m128i *)0x0 ||
                           (b_02 == (__m128i *)0x0 ||
                           (ptr_02 == (__m128i *)0x0 || ptr_01 == (__m128i *)0x0))) ||
                           ((b_01 == (__m128i *)0x0 ||
                            (ptr_00 == (__m128i *)0x0 || b_00 == (__m128i *)0x0)) ||
                           ((palVar20 == (__m128i *)0x0 || b == (__m128i *)0x0) ||
                           (ptr == (__m128i *)0x0 || palVar19 == (__m128i *)0x0)));
              if ((ptr_03 != (int16_t *)0x0 && b_04 != (__m128i *)0x0) &&
                  ((b_03 != (__m128i *)0x0 &&
                   (b_02 != (__m128i *)0x0 && (ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0)
                   )) && ((b_01 != (__m128i *)0x0 &&
                          (ptr_00 != (__m128i *)0x0 && b_00 != (__m128i *)0x0)) &&
                         ((palVar20 != (__m128i *)0x0 && b != (__m128i *)0x0) &&
                         (ptr != (__m128i *)0x0 && palVar19 != (__m128i *)0x0))))) {
                iVar14 = s2Len + -1;
                uVar21 = 7 - iVar13;
                len = (size_t)uVar21;
                auVar44 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar42 = auVar44._0_4_;
                auVar44 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar43 = auVar44._0_4_;
                local_220 = iVar36 - 0x7fff;
                auVar44 = pshuflw(ZEXT416(local_220),ZEXT416(local_220),0);
                local_128 = auVar44._0_2_;
                sStack_126 = auVar44._2_2_;
                auVar45 = ZEXT416(CONCAT22((short)(uVar23 >> 0x10),0x7ffe - (short)iVar17));
                auVar45 = pshuflw(auVar45,auVar45,0);
                auVar46 = pshuflw(ZEXT416(uVar21),ZEXT416(uVar21),0);
                local_118 = auVar46._0_2_;
                sStack_116 = auVar46._2_2_;
                c[0] = uVar39;
                parasail_memset___m128i(b,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = uVar39;
                parasail_memset___m128i(b_00,c_00,len);
                c_01[1] = extraout_RDX_01;
                c_01[0] = uVar39;
                parasail_memset___m128i(b_01,c_01,len);
                c_02[1] = extraout_RDX_02;
                c_02[0] = uVar39;
                parasail_memset___m128i(b_02,c_02,len);
                c_03[1] = extraout_RDX_03;
                c_03[0] = uVar39;
                parasail_memset___m128i(b_03,c_03,len);
                c_04[1] = extraout_RDX_04;
                c_04[0] = uVar39;
                parasail_memset___m128i(b_04,c_04,len);
                lVar24 = (long)(int)uVar28;
                uVar31 = 0;
                do {
                  lVar35 = 0;
                  lVar34 = lVar24;
                  do {
                    lVar37 = lVar34;
                    if (s1_beg != 0) {
                      lVar37 = 0;
                    }
                    uVar25 = 0x8000;
                    if (-0x8000 < lVar37) {
                      uVar25 = (undefined2)lVar37;
                    }
                    *(undefined2 *)((long)&local_48 + lVar35 * 2) = uVar25;
                    lVar37 = lVar37 - (ulong)(uint)open;
                    if (lVar37 < -0x7fff) {
                      lVar37 = -0x8000;
                    }
                    *(short *)((long)&local_58 + lVar35 * 2) = (short)lVar37;
                    lVar35 = lVar35 + 1;
                    lVar34 = lVar34 - uVar39 * (uint)gap;
                  } while (lVar35 != 8);
                  palVar19[uVar31][0] = local_48;
                  palVar19[uVar31][1] = lStack_40;
                  ptr_02[uVar31][0] = local_58;
                  ptr_02[uVar31][1] = lStack_50;
                  uVar31 = uVar31 + 1;
                  lVar24 = lVar24 - (ulong)(uint)gap;
                } while (uVar31 != uVar39);
                *ptr_03 = 0;
                uVar31 = 1;
                uVar23 = uVar28;
                do {
                  iVar27 = -0x8000;
                  if (-0x8000 < (int)uVar23) {
                    iVar27 = (int16_t)uVar23;
                  }
                  if (s2_beg != 0) {
                    iVar27 = 0;
                  }
                  ptr_03[uVar31] = iVar27;
                  uVar31 = uVar31 + 1;
                  uVar23 = uVar23 - gap;
                } while (s2Len + 1 != uVar31);
                uVar23 = uVar38 - 1;
                if (s2Len < 2) {
                  uVar32 = 1;
                }
                lVar24 = (ulong)(uVar38 + (uVar38 == 0)) << 4;
                uVar31 = 0;
                auVar46._4_2_ = local_128;
                auVar46._0_4_ = auVar44._0_4_;
                auVar46._6_2_ = sStack_126;
                auVar46._8_2_ = local_128;
                auVar46._10_2_ = sStack_126;
                auVar46._12_2_ = local_128;
                auVar46._14_2_ = sStack_126;
                local_c8 = auVar45._0_2_;
                uStack_c6 = auVar45._2_2_;
                auVar45 = auVar46;
                auVar70 = auVar46;
                auVar64 = auVar46;
                auVar97 = auVar46;
                iVar36 = iVar14;
                uVar78 = local_c8;
                uVar79 = uStack_c6;
                uVar80 = local_c8;
                uVar81 = uStack_c6;
                uVar82 = local_c8;
                uVar83 = uStack_c6;
                uVar84 = local_c8;
                uVar85 = uStack_c6;
                do {
                  local_1e8 = ptr_00;
                  local_1f0 = ptr_01;
                  ptr_05 = ptr;
                  ptr_01 = b_01;
                  ptr_04 = b;
                  ptr_00 = b_00;
                  ptr = palVar19;
                  b = palVar20;
                  uVar62 = ptr[uVar23][0];
                  uVar30 = ptr_04[uVar23][0];
                  uVar55 = ptr_00[uVar23][0];
                  uVar9 = ptr_01[uVar23][0];
                  auVar108._0_8_ = uVar30 << 0x10;
                  auVar108._8_8_ = ptr_04[uVar23][1] << 0x10 | uVar30 >> 0x30;
                  auVar121._0_8_ = uVar55 << 0x10;
                  auVar121._8_8_ = ptr_00[uVar23][1] << 0x10 | uVar55 >> 0x30;
                  auVar123._0_8_ = uVar9 << 0x10;
                  auVar123._8_8_ = ptr_01[uVar23][1] << 0x10 | uVar9 >> 0x30;
                  auVar59._8_8_ = ptr[uVar23][1] << 0x10 | uVar62 >> 0x30;
                  auVar59._0_8_ = uVar62 << 0x10 | (ulong)(ushort)ptr_03[uVar31];
                  lVar34 = (long)ppVar6->mapper[(byte)s2[uVar31]] * uVar39 * 0x10;
                  auVar110 = (undefined1  [16])0x0;
                  lVar35 = 0;
                  in_XMM11 = pmovsxbw(in_XMM11,0x101010101010101);
                  auVar112 = (undefined1  [16])0x0;
                  auVar111._4_2_ = local_128;
                  auVar111._0_4_ = auVar44._0_4_;
                  auVar111._6_2_ = sStack_126;
                  auVar111._8_2_ = local_128;
                  auVar111._10_2_ = sStack_126;
                  auVar111._12_2_ = local_128;
                  auVar111._14_2_ = sStack_126;
                  do {
                    auVar59 = paddsw(auVar59,*(undefined1 (*) [16])((long)pvVar5 + lVar35 + lVar34))
                    ;
                    pauVar1 = (undefined1 (*) [16])((long)*ptr_02 + lVar35);
                    sVar86 = *(short *)*pauVar1;
                    sVar41 = *(short *)(*pauVar1 + 2);
                    sVar51 = *(short *)(*pauVar1 + 4);
                    sVar52 = *(short *)(*pauVar1 + 6);
                    sVar53 = *(short *)(*pauVar1 + 8);
                    sVar54 = *(short *)(*pauVar1 + 10);
                    sVar56 = *(short *)(*pauVar1 + 0xc);
                    sVar57 = *(short *)(*pauVar1 + 0xe);
                    auVar47 = *pauVar1;
                    uVar87 = auVar59._0_2_;
                    uVar67 = (ushort)((short)uVar87 < sVar86) * sVar86 |
                             ((short)uVar87 >= sVar86) * uVar87;
                    uVar88 = auVar59._2_2_;
                    uVar71 = (ushort)((short)uVar88 < sVar41) * sVar41 |
                             ((short)uVar88 >= sVar41) * uVar88;
                    uVar89 = auVar59._4_2_;
                    uVar72 = (ushort)((short)uVar89 < sVar51) * sVar51 |
                             ((short)uVar89 >= sVar51) * uVar89;
                    uVar90 = auVar59._6_2_;
                    uVar73 = (ushort)((short)uVar90 < sVar52) * sVar52 |
                             ((short)uVar90 >= sVar52) * uVar90;
                    uVar91 = auVar59._8_2_;
                    uVar74 = (ushort)((short)uVar91 < sVar53) * sVar53 |
                             ((short)uVar91 >= sVar53) * uVar91;
                    uVar92 = auVar59._10_2_;
                    uVar75 = (ushort)((short)uVar92 < sVar54) * sVar54 |
                             ((short)uVar92 >= sVar54) * uVar92;
                    uVar93 = auVar59._12_2_;
                    uVar94 = auVar59._14_2_;
                    uVar76 = (ushort)((short)uVar93 < sVar56) * sVar56 |
                             ((short)uVar93 >= sVar56) * uVar93;
                    uVar77 = (ushort)((short)uVar94 < sVar57) * sVar57 |
                             ((short)uVar94 >= sVar57) * uVar94;
                    sVar86 = auVar111._0_2_;
                    auVar63._0_2_ =
                         (ushort)((short)uVar67 < sVar86) * sVar86 |
                         ((short)uVar67 >= sVar86) * uVar67;
                    sVar41 = auVar111._2_2_;
                    auVar63._2_2_ =
                         (ushort)((short)uVar71 < sVar41) * sVar41 |
                         ((short)uVar71 >= sVar41) * uVar71;
                    sVar51 = auVar111._4_2_;
                    auVar63._4_2_ =
                         (ushort)((short)uVar72 < sVar51) * sVar51 |
                         ((short)uVar72 >= sVar51) * uVar72;
                    sVar52 = auVar111._6_2_;
                    auVar63._6_2_ =
                         (ushort)((short)uVar73 < sVar52) * sVar52 |
                         ((short)uVar73 >= sVar52) * uVar73;
                    sVar53 = auVar111._8_2_;
                    auVar63._8_2_ =
                         (ushort)((short)uVar74 < sVar53) * sVar53 |
                         ((short)uVar74 >= sVar53) * uVar74;
                    sVar54 = auVar111._10_2_;
                    auVar63._10_2_ =
                         (ushort)((short)uVar75 < sVar54) * sVar54 |
                         ((short)uVar75 >= sVar54) * uVar75;
                    sVar56 = auVar111._12_2_;
                    auVar63._12_2_ =
                         (ushort)((short)uVar76 < sVar56) * sVar56 |
                         ((short)uVar76 >= sVar56) * uVar76;
                    sVar57 = auVar111._14_2_;
                    auVar63._14_2_ =
                         (ushort)((short)uVar77 < sVar57) * sVar57 |
                         ((short)uVar77 >= sVar57) * uVar77;
                    auVar59 = *(undefined1 (*) [16])((long)*b_02 + lVar35);
                    auVar100 = *(undefined1 (*) [16])((long)*b_03 + lVar35);
                    pauVar1 = (undefined1 (*) [16])((long)*b_04 + lVar35);
                    auVar11 = *pauVar1;
                    auVar122 = *pauVar1;
                    *(undefined1 (*) [16])((long)*ptr_05 + lVar35) = auVar63;
                    auVar68._0_2_ = -(ushort)(sVar86 < (short)uVar67);
                    auVar68._2_2_ = -(ushort)(sVar41 < (short)uVar71);
                    auVar68._4_2_ = -(ushort)(sVar51 < (short)uVar72);
                    auVar68._6_2_ = -(ushort)(sVar52 < (short)uVar73);
                    auVar68._8_2_ = -(ushort)(sVar53 < (short)uVar74);
                    auVar68._10_2_ = -(ushort)(sVar54 < (short)uVar75);
                    auVar68._12_2_ = -(ushort)(sVar56 < (short)uVar76);
                    auVar68._14_2_ = -(ushort)(sVar57 < (short)uVar77);
                    auVar95 = pblendvb(auVar112,auVar59,auVar68);
                    auVar108 = paddsw(auVar108,*(undefined1 (*) [16])
                                                ((long)pvVar7 + lVar35 + lVar34));
                    auVar60._0_2_ = -(ushort)(uVar87 == auVar63._0_2_);
                    auVar60._2_2_ = -(ushort)(uVar88 == auVar63._2_2_);
                    auVar60._4_2_ = -(ushort)(uVar89 == auVar63._4_2_);
                    auVar60._6_2_ = -(ushort)(uVar90 == auVar63._6_2_);
                    auVar60._8_2_ = -(ushort)(uVar91 == auVar63._8_2_);
                    auVar60._10_2_ = -(ushort)(uVar92 == auVar63._10_2_);
                    auVar60._12_2_ = -(ushort)(uVar93 == auVar63._12_2_);
                    auVar60._14_2_ = -(ushort)(uVar94 == auVar63._14_2_);
                    auVar96 = pblendvb(auVar95,auVar108,auVar60);
                    *(undefined1 (*) [16])((long)*b + lVar35) = auVar96;
                    auVar108 = pblendvb(auVar110,auVar100,auVar68);
                    auVar121 = paddsw(auVar121,*(undefined1 (*) [16])
                                                ((long)pvVar8 + lVar35 + lVar34));
                    auVar109 = pblendvb(auVar108,auVar121,auVar60);
                    *(undefined1 (*) [16])((long)*local_1e8 + lVar35) = auVar109;
                    auVar122 = pblendvb(in_XMM11,auVar122,auVar68);
                    auVar108 = pmovsxbw(auVar68,0x101010101010101);
                    auVar121 = paddsw(auVar123,auVar108);
                    auVar123 = pblendvb(auVar122,auVar121,auVar60);
                    *(undefined1 (*) [16])((long)*local_1f0 + lVar35) = auVar123;
                    uVar78 = ((short)auVar63._0_2_ < (short)uVar78) * auVar63._0_2_ |
                             ((short)auVar63._0_2_ >= (short)uVar78) * uVar78;
                    uVar79 = ((short)auVar63._2_2_ < (short)uVar79) * auVar63._2_2_ |
                             ((short)auVar63._2_2_ >= (short)uVar79) * uVar79;
                    uVar80 = ((short)auVar63._4_2_ < (short)uVar80) * auVar63._4_2_ |
                             ((short)auVar63._4_2_ >= (short)uVar80) * uVar80;
                    uVar81 = ((short)auVar63._6_2_ < (short)uVar81) * auVar63._6_2_ |
                             ((short)auVar63._6_2_ >= (short)uVar81) * uVar81;
                    uVar82 = ((short)auVar63._8_2_ < (short)uVar82) * auVar63._8_2_ |
                             ((short)auVar63._8_2_ >= (short)uVar82) * uVar82;
                    uVar83 = ((short)auVar63._10_2_ < (short)uVar83) * auVar63._10_2_ |
                             ((short)auVar63._10_2_ >= (short)uVar83) * uVar83;
                    uVar84 = ((short)auVar63._12_2_ < (short)uVar84) * auVar63._12_2_ |
                             ((short)auVar63._12_2_ >= (short)uVar84) * uVar84;
                    uVar85 = ((short)auVar63._14_2_ < (short)uVar85) * auVar63._14_2_ |
                             ((short)auVar63._14_2_ >= (short)uVar85) * uVar85;
                    sVar86 = auVar64._0_2_;
                    uVar67 = (sVar86 < (short)auVar63._0_2_) * auVar63._0_2_ |
                             (ushort)(sVar86 >= (short)auVar63._0_2_) * sVar86;
                    sVar86 = auVar64._2_2_;
                    uVar71 = (sVar86 < (short)auVar63._2_2_) * auVar63._2_2_ |
                             (ushort)(sVar86 >= (short)auVar63._2_2_) * sVar86;
                    sVar86 = auVar64._4_2_;
                    uVar89 = (sVar86 < (short)auVar63._4_2_) * auVar63._4_2_ |
                             (ushort)(sVar86 >= (short)auVar63._4_2_) * sVar86;
                    sVar86 = auVar64._6_2_;
                    uVar90 = (sVar86 < (short)auVar63._6_2_) * auVar63._6_2_ |
                             (ushort)(sVar86 >= (short)auVar63._6_2_) * sVar86;
                    sVar86 = auVar64._8_2_;
                    uVar91 = (sVar86 < (short)auVar63._8_2_) * auVar63._8_2_ |
                             (ushort)(sVar86 >= (short)auVar63._8_2_) * sVar86;
                    sVar86 = auVar64._10_2_;
                    uVar92 = (sVar86 < (short)auVar63._10_2_) * auVar63._10_2_ |
                             (ushort)(sVar86 >= (short)auVar63._10_2_) * sVar86;
                    sVar86 = auVar64._12_2_;
                    sVar41 = auVar64._14_2_;
                    uVar76 = (sVar86 < (short)auVar63._12_2_) * auVar63._12_2_ |
                             (ushort)(sVar86 >= (short)auVar63._12_2_) * sVar86;
                    uVar77 = (sVar41 < (short)auVar63._14_2_) * auVar63._14_2_ |
                             (ushort)(sVar41 >= (short)auVar63._14_2_) * sVar41;
                    sVar86 = auVar123._0_2_;
                    sVar41 = auVar109._0_2_;
                    uVar87 = (ushort)(sVar41 < sVar86) * sVar86 |
                             (ushort)(sVar41 >= sVar86) * sVar41;
                    sVar86 = auVar123._2_2_;
                    sVar41 = auVar109._2_2_;
                    uVar88 = (ushort)(sVar41 < sVar86) * sVar86 |
                             (ushort)(sVar41 >= sVar86) * sVar41;
                    sVar86 = auVar123._4_2_;
                    sVar41 = auVar109._4_2_;
                    uVar72 = (ushort)(sVar41 < sVar86) * sVar86 |
                             (ushort)(sVar41 >= sVar86) * sVar41;
                    sVar86 = auVar123._6_2_;
                    sVar41 = auVar109._6_2_;
                    uVar73 = (ushort)(sVar41 < sVar86) * sVar86 |
                             (ushort)(sVar41 >= sVar86) * sVar41;
                    sVar86 = auVar123._8_2_;
                    sVar41 = auVar109._8_2_;
                    uVar74 = (ushort)(sVar41 < sVar86) * sVar86 |
                             (ushort)(sVar41 >= sVar86) * sVar41;
                    sVar86 = auVar123._10_2_;
                    sVar41 = auVar109._10_2_;
                    uVar75 = (ushort)(sVar41 < sVar86) * sVar86 |
                             (ushort)(sVar41 >= sVar86) * sVar41;
                    sVar86 = auVar123._12_2_;
                    sVar41 = auVar109._12_2_;
                    sVar51 = auVar109._14_2_;
                    uVar93 = (ushort)(sVar41 < sVar86) * sVar86 |
                             (ushort)(sVar41 >= sVar86) * sVar41;
                    sVar86 = auVar123._14_2_;
                    uVar94 = (ushort)(sVar51 < sVar86) * sVar86 |
                             (ushort)(sVar51 >= sVar86) * sVar51;
                    auVar95._4_4_ = uVar42;
                    auVar95._0_4_ = uVar42;
                    auVar95._8_4_ = uVar42;
                    auVar95._12_4_ = uVar42;
                    auVar64 = psubsw(auVar63,auVar95);
                    auVar122._4_4_ = uVar43;
                    auVar122._0_4_ = uVar43;
                    auVar122._8_4_ = uVar43;
                    auVar122._12_4_ = uVar43;
                    auVar108 = psubsw(auVar47,auVar122);
                    sVar41 = auVar64._0_2_;
                    sVar99 = auVar108._0_2_;
                    auVar47._0_2_ = -(ushort)(sVar99 < sVar41);
                    sVar51 = auVar64._2_2_;
                    sVar101 = auVar108._2_2_;
                    auVar47._2_2_ = -(ushort)(sVar101 < sVar51);
                    sVar52 = auVar64._4_2_;
                    sVar102 = auVar108._4_2_;
                    auVar47._4_2_ = -(ushort)(sVar102 < sVar52);
                    sVar53 = auVar64._6_2_;
                    sVar103 = auVar108._6_2_;
                    auVar47._6_2_ = -(ushort)(sVar103 < sVar53);
                    sVar54 = auVar64._8_2_;
                    sVar104 = auVar108._8_2_;
                    auVar47._8_2_ = -(ushort)(sVar104 < sVar54);
                    sVar56 = auVar64._10_2_;
                    sVar105 = auVar108._10_2_;
                    auVar47._10_2_ = -(ushort)(sVar105 < sVar56);
                    sVar57 = auVar64._12_2_;
                    sVar106 = auVar108._12_2_;
                    sVar58 = auVar64._14_2_;
                    auVar47._12_2_ = -(ushort)(sVar106 < sVar57);
                    sVar107 = auVar108._14_2_;
                    auVar47._14_2_ = -(ushort)(sVar107 < sVar58);
                    auVar59 = pblendvb(auVar59,auVar96,auVar47);
                    auVar108 = pblendvb(auVar100,auVar109,auVar47);
                    auVar121 = pmovsxbw(auVar121,0x101010101010101);
                    auVar64 = paddsw(auVar11,auVar121);
                    auVar123 = paddsw(auVar123,auVar121);
                    auVar121 = pblendvb(auVar64,auVar123,auVar47);
                    auVar64 = psubsw(auVar111,auVar122);
                    sVar113 = auVar64._0_2_;
                    auVar100._0_2_ = -(ushort)(sVar113 < sVar41);
                    sVar114 = auVar64._2_2_;
                    auVar100._2_2_ = -(ushort)(sVar114 < sVar51);
                    sVar115 = auVar64._4_2_;
                    auVar100._4_2_ = -(ushort)(sVar115 < sVar52);
                    sVar116 = auVar64._6_2_;
                    auVar100._6_2_ = -(ushort)(sVar116 < sVar53);
                    sVar117 = auVar64._8_2_;
                    auVar100._8_2_ = -(ushort)(sVar117 < sVar54);
                    sVar118 = auVar64._10_2_;
                    auVar100._10_2_ = -(ushort)(sVar118 < sVar56);
                    sVar119 = auVar64._12_2_;
                    auVar100._12_2_ = -(ushort)(sVar119 < sVar57);
                    sVar120 = auVar64._14_2_;
                    auVar100._14_2_ = -(ushort)(sVar120 < sVar58);
                    auVar112 = pblendvb(auVar112,auVar96,auVar100);
                    sVar86 = auVar96._0_2_;
                    uVar67 = (ushort)((short)uVar67 < sVar86) * sVar86 |
                             ((short)uVar67 >= sVar86) * uVar67;
                    sVar86 = auVar96._2_2_;
                    uVar71 = (ushort)((short)uVar71 < sVar86) * sVar86 |
                             ((short)uVar71 >= sVar86) * uVar71;
                    sVar86 = auVar96._4_2_;
                    uVar89 = (ushort)((short)uVar89 < sVar86) * sVar86 |
                             ((short)uVar89 >= sVar86) * uVar89;
                    sVar86 = auVar96._6_2_;
                    uVar90 = (ushort)((short)uVar90 < sVar86) * sVar86 |
                             ((short)uVar90 >= sVar86) * uVar90;
                    sVar86 = auVar96._8_2_;
                    uVar91 = (ushort)((short)uVar91 < sVar86) * sVar86 |
                             ((short)uVar91 >= sVar86) * uVar91;
                    sVar86 = auVar96._10_2_;
                    uVar92 = (ushort)((short)uVar92 < sVar86) * sVar86 |
                             ((short)uVar92 >= sVar86) * uVar92;
                    sVar86 = auVar96._12_2_;
                    uVar76 = (ushort)((short)uVar76 < sVar86) * sVar86 |
                             ((short)uVar76 >= sVar86) * uVar76;
                    sVar86 = auVar96._14_2_;
                    uVar77 = (ushort)((short)uVar77 < sVar86) * sVar86 |
                             ((short)uVar77 >= sVar86) * uVar77;
                    auVar64._0_2_ =
                         ((short)uVar87 < (short)uVar67) * uVar67 |
                         ((short)uVar87 >= (short)uVar67) * uVar87;
                    auVar64._2_2_ =
                         ((short)uVar88 < (short)uVar71) * uVar71 |
                         ((short)uVar88 >= (short)uVar71) * uVar88;
                    auVar64._4_2_ =
                         ((short)uVar72 < (short)uVar89) * uVar89 |
                         ((short)uVar72 >= (short)uVar89) * uVar72;
                    auVar64._6_2_ =
                         ((short)uVar73 < (short)uVar90) * uVar90 |
                         ((short)uVar73 >= (short)uVar90) * uVar73;
                    auVar64._8_2_ =
                         ((short)uVar74 < (short)uVar91) * uVar91 |
                         ((short)uVar74 >= (short)uVar91) * uVar74;
                    auVar64._10_2_ =
                         ((short)uVar75 < (short)uVar92) * uVar92 |
                         ((short)uVar75 >= (short)uVar92) * uVar75;
                    auVar64._12_2_ =
                         ((short)uVar93 < (short)uVar76) * uVar76 |
                         ((short)uVar93 >= (short)uVar76) * uVar93;
                    auVar64._14_2_ =
                         ((short)uVar94 < (short)uVar77) * uVar77 |
                         ((short)uVar94 >= (short)uVar77) * uVar94;
                    puVar2 = (ushort *)((long)*ptr_02 + lVar35);
                    *puVar2 = (ushort)(sVar41 < sVar99) * sVar99 |
                              (ushort)(sVar41 >= sVar99) * sVar41;
                    puVar2[1] = (ushort)(sVar51 < sVar101) * sVar101 |
                                (ushort)(sVar51 >= sVar101) * sVar51;
                    puVar2[2] = (ushort)(sVar52 < sVar102) * sVar102 |
                                (ushort)(sVar52 >= sVar102) * sVar52;
                    puVar2[3] = (ushort)(sVar53 < sVar103) * sVar103 |
                                (ushort)(sVar53 >= sVar103) * sVar53;
                    puVar2[4] = (ushort)(sVar54 < sVar104) * sVar104 |
                                (ushort)(sVar54 >= sVar104) * sVar54;
                    puVar2[5] = (ushort)(sVar56 < sVar105) * sVar105 |
                                (ushort)(sVar56 >= sVar105) * sVar56;
                    puVar2[6] = (ushort)(sVar57 < sVar106) * sVar106 |
                                (ushort)(sVar57 >= sVar106) * sVar57;
                    puVar2[7] = (ushort)(sVar58 < sVar107) * sVar107 |
                                (ushort)(sVar58 >= sVar107) * sVar58;
                    local_1a8 = auVar59._0_8_;
                    uStack_1a0 = auVar59._8_8_;
                    puVar3 = (undefined8 *)((long)*b_02 + lVar35);
                    *puVar3 = local_1a8;
                    puVar3[1] = uStack_1a0;
                    local_1b8 = auVar108._0_8_;
                    uStack_1b0 = auVar108._8_8_;
                    puVar3 = (undefined8 *)((long)*b_03 + lVar35);
                    *puVar3 = local_1b8;
                    puVar3[1] = uStack_1b0;
                    *(undefined1 (*) [16])((long)*b_04 + lVar35) = auVar121;
                    auVar111._0_2_ =
                         (ushort)(sVar41 < sVar113) * sVar113 | (ushort)(sVar41 >= sVar113) * sVar41
                    ;
                    auVar111._2_2_ =
                         (ushort)(sVar51 < sVar114) * sVar114 | (ushort)(sVar51 >= sVar114) * sVar51
                    ;
                    auVar111._4_2_ =
                         (ushort)(sVar52 < sVar115) * sVar115 | (ushort)(sVar52 >= sVar115) * sVar52
                    ;
                    auVar111._6_2_ =
                         (ushort)(sVar53 < sVar116) * sVar116 | (ushort)(sVar53 >= sVar116) * sVar53
                    ;
                    auVar111._8_2_ =
                         (ushort)(sVar54 < sVar117) * sVar117 | (ushort)(sVar54 >= sVar117) * sVar54
                    ;
                    auVar111._10_2_ =
                         (ushort)(sVar56 < sVar118) * sVar118 | (ushort)(sVar56 >= sVar118) * sVar56
                    ;
                    auVar111._12_2_ =
                         (ushort)(sVar57 < sVar119) * sVar119 | (ushort)(sVar57 >= sVar119) * sVar57
                    ;
                    auVar111._14_2_ =
                         (ushort)(sVar58 < sVar120) * sVar120 | (ushort)(sVar58 >= sVar120) * sVar58
                    ;
                    auVar110 = pblendvb(auVar110,auVar109,auVar100);
                    auVar59 = paddsw(in_XMM11,_DAT_008d0b80);
                    in_XMM11 = pblendvb(auVar59,auVar123,auVar100);
                    auVar59 = *(undefined1 (*) [16])((long)*ptr + lVar35);
                    auVar108 = *(undefined1 (*) [16])((long)*ptr_04 + lVar35);
                    auVar121 = *(undefined1 (*) [16])((long)*ptr_00 + lVar35);
                    auVar123 = *(undefined1 (*) [16])((long)*ptr_01 + lVar35);
                    lVar35 = lVar35 + 0x10;
                  } while (lVar24 != lVar35);
                  auVar96._4_4_ = uVar42;
                  auVar96._0_4_ = uVar42;
                  auVar96._8_4_ = uVar42;
                  auVar96._12_4_ = uVar42;
                  auVar11._4_4_ = uVar43;
                  auVar11._0_4_ = uVar43;
                  auVar11._8_4_ = uVar43;
                  auVar11._12_4_ = uVar43;
                  auVar59 = pmovsxbw(auVar121,0x101010101010101);
                  uVar15 = 0;
                  do {
                    uVar62 = ptr[uVar23][0];
                    uVar29 = uVar28;
                    if (s2_beg == 0) {
                      uVar29 = ptr_03[uVar31 + 1] - open;
                    }
                    uVar30 = (ulong)uVar29;
                    if ((int)uVar29 < -0x7fff) {
                      uVar30 = 0xffff8000;
                    }
                    lVar35 = auVar112._8_8_;
                    uVar55 = auVar112._0_8_;
                    auVar112._0_8_ = uVar55 << 0x10;
                    auVar112._8_8_ = lVar35 << 0x10 | uVar55 >> 0x30;
                    auVar109._8_8_ = ptr[uVar23][1] << 0x10 | uVar62 >> 0x30;
                    auVar109._0_8_ = uVar62 << 0x10 | (ulong)(ushort)ptr_03[uVar31];
                    lVar35 = auVar110._8_8_;
                    uVar62 = auVar110._0_8_;
                    auVar110._0_8_ = uVar62 << 0x10;
                    auVar110._8_8_ = lVar35 << 0x10 | uVar62 >> 0x30;
                    uVar62 = auVar111._0_8_;
                    auVar111._8_8_ = auVar111._8_8_ << 0x10 | uVar62 >> 0x30;
                    auVar111._0_8_ = uVar62 << 0x10 | uVar30 & 0xffff;
                    uVar62 = in_XMM11._0_8_;
                    in_XMM11._8_8_ = in_XMM11._8_8_ << 0x10 | uVar62 >> 0x30;
                    in_XMM11._0_8_ = uVar62 << 0x10 | 1;
                    lVar35 = 0;
                    do {
                      auVar109 = paddsw(auVar109,*(undefined1 (*) [16])
                                                  ((long)pvVar5 + lVar35 + lVar34));
                      psVar4 = (short *)((long)*ptr_05 + lVar35);
                      sVar58 = *psVar4;
                      sVar99 = psVar4[1];
                      sVar101 = psVar4[2];
                      sVar102 = psVar4[3];
                      sVar103 = psVar4[4];
                      sVar104 = psVar4[5];
                      sVar105 = psVar4[6];
                      sVar106 = psVar4[7];
                      sVar86 = auVar111._0_2_;
                      auVar65._0_2_ =
                           (ushort)(sVar58 < sVar86) * sVar86 | (ushort)(sVar58 >= sVar86) * sVar58;
                      sVar41 = auVar111._2_2_;
                      auVar65._2_2_ =
                           (ushort)(sVar99 < sVar41) * sVar41 | (ushort)(sVar99 >= sVar41) * sVar99;
                      sVar51 = auVar111._4_2_;
                      auVar65._4_2_ =
                           (ushort)(sVar101 < sVar51) * sVar51 |
                           (ushort)(sVar101 >= sVar51) * sVar101;
                      sVar52 = auVar111._6_2_;
                      auVar65._6_2_ =
                           (ushort)(sVar102 < sVar52) * sVar52 |
                           (ushort)(sVar102 >= sVar52) * sVar102;
                      sVar53 = auVar111._8_2_;
                      auVar65._8_2_ =
                           (ushort)(sVar103 < sVar53) * sVar53 |
                           (ushort)(sVar103 >= sVar53) * sVar103;
                      sVar54 = auVar111._10_2_;
                      auVar65._10_2_ =
                           (ushort)(sVar104 < sVar54) * sVar54 |
                           (ushort)(sVar104 >= sVar54) * sVar104;
                      sVar56 = auVar111._12_2_;
                      auVar65._12_2_ =
                           (ushort)(sVar105 < sVar56) * sVar56 |
                           (ushort)(sVar105 >= sVar56) * sVar105;
                      sVar57 = auVar111._14_2_;
                      auVar65._14_2_ =
                           (ushort)(sVar106 < sVar57) * sVar57 |
                           (ushort)(sVar106 >= sVar57) * sVar106;
                      *(undefined1 (*) [16])((long)*ptr_05 + lVar35) = auVar65;
                      auVar69._0_2_ = -(ushort)(auVar65._0_2_ == auVar109._0_2_);
                      auVar69._2_2_ = -(ushort)(auVar65._2_2_ == auVar109._2_2_);
                      auVar69._4_2_ = -(ushort)(auVar65._4_2_ == auVar109._4_2_);
                      auVar69._6_2_ = -(ushort)(auVar65._6_2_ == auVar109._6_2_);
                      auVar69._8_2_ = -(ushort)(auVar65._8_2_ == auVar109._8_2_);
                      auVar69._10_2_ = -(ushort)(auVar65._10_2_ == auVar109._10_2_);
                      auVar69._12_2_ = -(ushort)(auVar65._12_2_ == auVar109._12_2_);
                      auVar69._14_2_ = -(ushort)(auVar65._14_2_ == auVar109._14_2_);
                      auVar48._0_2_ = -(ushort)(sVar86 < sVar58);
                      auVar48._2_2_ = -(ushort)(sVar41 < sVar99);
                      auVar48._4_2_ = -(ushort)(sVar51 < sVar101);
                      auVar48._6_2_ = -(ushort)(sVar52 < sVar102);
                      auVar48._8_2_ = -(ushort)(sVar53 < sVar103);
                      auVar48._10_2_ = -(ushort)(sVar54 < sVar104);
                      auVar48._12_2_ = -(ushort)(sVar56 < sVar105);
                      auVar48._14_2_ = -(ushort)(sVar57 < sVar106);
                      auVar48 = auVar48 | auVar69;
                      auVar121 = pblendvb(auVar112,*(undefined1 (*) [16])((long)*b + lVar35),auVar48
                                         );
                      *(undefined1 (*) [16])((long)*b + lVar35) = auVar121;
                      auVar123 = pblendvb(auVar110,*(undefined1 (*) [16])((long)*local_1e8 + lVar35)
                                          ,auVar48);
                      *(undefined1 (*) [16])((long)*local_1e8 + lVar35) = auVar123;
                      auVar100 = pblendvb(in_XMM11,*(undefined1 (*) [16])((long)*local_1f0 + lVar35)
                                          ,auVar48);
                      *(undefined1 (*) [16])((long)*local_1f0 + lVar35) = auVar100;
                      auVar108 = psubsw(auVar65,auVar96);
                      auVar122 = psubsw(auVar111,auVar11);
                      auVar49._0_2_ = -(ushort)(auVar122._0_2_ < auVar108._0_2_);
                      auVar49._2_2_ = -(ushort)(auVar122._2_2_ < auVar108._2_2_);
                      auVar49._4_2_ = -(ushort)(auVar122._4_2_ < auVar108._4_2_);
                      auVar49._6_2_ = -(ushort)(auVar122._6_2_ < auVar108._6_2_);
                      auVar49._8_2_ = -(ushort)(auVar122._8_2_ < auVar108._8_2_);
                      auVar49._10_2_ = -(ushort)(auVar122._10_2_ < auVar108._10_2_);
                      auVar49._12_2_ = -(ushort)(auVar122._12_2_ < auVar108._12_2_);
                      auVar49._14_2_ = -(ushort)(auVar122._14_2_ < auVar108._14_2_);
                      uVar67 = ((ushort)(SUB161(auVar49 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                                (ushort)((byte)(auVar49._14_2_ >> 7) & 1) << 0xe |
                               auVar49._14_2_ & 0x8000) ^ 0xffff;
                      if (uVar67 == 0) {
                        iVar17 = 0x27;
                      }
                      else {
                        auVar112 = pblendvb(auVar112,auVar121,auVar49);
                        auVar110 = pblendvb(auVar110,auVar123,auVar49);
                        auVar111 = paddsw(in_XMM11,auVar59);
                        auVar108 = paddsw(auVar100,auVar59);
                        in_XMM11 = pblendvb(auVar111,auVar108,auVar49);
                        auVar109 = *(undefined1 (*) [16])((long)*ptr + lVar35);
                        iVar17 = 0;
                        auVar111 = auVar122;
                      }
                      uVar78 = ((short)auVar65._0_2_ < (short)uVar78) * auVar65._0_2_ |
                               ((short)auVar65._0_2_ >= (short)uVar78) * uVar78;
                      uVar79 = ((short)auVar65._2_2_ < (short)uVar79) * auVar65._2_2_ |
                               ((short)auVar65._2_2_ >= (short)uVar79) * uVar79;
                      uVar80 = ((short)auVar65._4_2_ < (short)uVar80) * auVar65._4_2_ |
                               ((short)auVar65._4_2_ >= (short)uVar80) * uVar80;
                      uVar81 = ((short)auVar65._6_2_ < (short)uVar81) * auVar65._6_2_ |
                               ((short)auVar65._6_2_ >= (short)uVar81) * uVar81;
                      uVar82 = ((short)auVar65._8_2_ < (short)uVar82) * auVar65._8_2_ |
                               ((short)auVar65._8_2_ >= (short)uVar82) * uVar82;
                      uVar83 = ((short)auVar65._10_2_ < (short)uVar83) * auVar65._10_2_ |
                               ((short)auVar65._10_2_ >= (short)uVar83) * uVar83;
                      uVar84 = ((short)auVar65._12_2_ < (short)uVar84) * auVar65._12_2_ |
                               ((short)auVar65._12_2_ >= (short)uVar84) * uVar84;
                      uVar85 = ((short)auVar65._14_2_ < (short)uVar85) * auVar65._14_2_ |
                               ((short)auVar65._14_2_ >= (short)uVar85) * uVar85;
                      sVar86 = auVar64._0_2_;
                      uVar87 = (sVar86 < (short)auVar65._0_2_) * auVar65._0_2_ |
                               (ushort)(sVar86 >= (short)auVar65._0_2_) * sVar86;
                      sVar86 = auVar64._2_2_;
                      uVar71 = (sVar86 < (short)auVar65._2_2_) * auVar65._2_2_ |
                               (ushort)(sVar86 >= (short)auVar65._2_2_) * sVar86;
                      sVar86 = auVar64._4_2_;
                      uVar88 = (sVar86 < (short)auVar65._4_2_) * auVar65._4_2_ |
                               (ushort)(sVar86 >= (short)auVar65._4_2_) * sVar86;
                      sVar86 = auVar64._6_2_;
                      uVar89 = (sVar86 < (short)auVar65._6_2_) * auVar65._6_2_ |
                               (ushort)(sVar86 >= (short)auVar65._6_2_) * sVar86;
                      sVar86 = auVar64._8_2_;
                      uVar72 = (sVar86 < (short)auVar65._8_2_) * auVar65._8_2_ |
                               (ushort)(sVar86 >= (short)auVar65._8_2_) * sVar86;
                      sVar86 = auVar64._10_2_;
                      uVar90 = (sVar86 < (short)auVar65._10_2_) * auVar65._10_2_ |
                               (ushort)(sVar86 >= (short)auVar65._10_2_) * sVar86;
                      sVar86 = auVar64._12_2_;
                      sVar41 = auVar64._14_2_;
                      uVar73 = (sVar86 < (short)auVar65._12_2_) * auVar65._12_2_ |
                               (ushort)(sVar86 >= (short)auVar65._12_2_) * sVar86;
                      uVar91 = (sVar41 < (short)auVar65._14_2_) * auVar65._14_2_ |
                               (ushort)(sVar41 >= (short)auVar65._14_2_) * sVar41;
                      sVar86 = auVar121._0_2_;
                      uVar87 = (ushort)((short)uVar87 < sVar86) * sVar86 |
                               ((short)uVar87 >= sVar86) * uVar87;
                      sVar86 = auVar121._2_2_;
                      uVar71 = (ushort)((short)uVar71 < sVar86) * sVar86 |
                               ((short)uVar71 >= sVar86) * uVar71;
                      sVar86 = auVar121._4_2_;
                      uVar88 = (ushort)((short)uVar88 < sVar86) * sVar86 |
                               ((short)uVar88 >= sVar86) * uVar88;
                      sVar86 = auVar121._6_2_;
                      uVar89 = (ushort)((short)uVar89 < sVar86) * sVar86 |
                               ((short)uVar89 >= sVar86) * uVar89;
                      sVar86 = auVar121._8_2_;
                      uVar72 = (ushort)((short)uVar72 < sVar86) * sVar86 |
                               ((short)uVar72 >= sVar86) * uVar72;
                      sVar86 = auVar121._10_2_;
                      uVar90 = (ushort)((short)uVar90 < sVar86) * sVar86 |
                               ((short)uVar90 >= sVar86) * uVar90;
                      sVar86 = auVar121._12_2_;
                      uVar73 = (ushort)((short)uVar73 < sVar86) * sVar86 |
                               ((short)uVar73 >= sVar86) * uVar73;
                      sVar86 = auVar121._14_2_;
                      uVar91 = (ushort)((short)uVar91 < sVar86) * sVar86 |
                               ((short)uVar91 >= sVar86) * uVar91;
                      sVar86 = auVar100._0_2_;
                      sVar41 = auVar123._0_2_;
                      uVar74 = (ushort)(sVar41 < sVar86) * sVar86 |
                               (ushort)(sVar41 >= sVar86) * sVar41;
                      sVar86 = auVar100._2_2_;
                      sVar41 = auVar123._2_2_;
                      uVar92 = (ushort)(sVar41 < sVar86) * sVar86 |
                               (ushort)(sVar41 >= sVar86) * sVar41;
                      sVar86 = auVar100._4_2_;
                      sVar41 = auVar123._4_2_;
                      uVar75 = (ushort)(sVar41 < sVar86) * sVar86 |
                               (ushort)(sVar41 >= sVar86) * sVar41;
                      sVar86 = auVar100._6_2_;
                      sVar41 = auVar123._6_2_;
                      uVar76 = (ushort)(sVar41 < sVar86) * sVar86 |
                               (ushort)(sVar41 >= sVar86) * sVar41;
                      sVar86 = auVar100._8_2_;
                      sVar41 = auVar123._8_2_;
                      uVar93 = (ushort)(sVar41 < sVar86) * sVar86 |
                               (ushort)(sVar41 >= sVar86) * sVar41;
                      sVar86 = auVar100._10_2_;
                      sVar41 = auVar123._10_2_;
                      uVar77 = (ushort)(sVar41 < sVar86) * sVar86 |
                               (ushort)(sVar41 >= sVar86) * sVar41;
                      sVar86 = auVar100._12_2_;
                      sVar41 = auVar123._12_2_;
                      sVar51 = auVar123._14_2_;
                      uVar94 = (ushort)(sVar41 < sVar86) * sVar86 |
                               (ushort)(sVar41 >= sVar86) * sVar41;
                      sVar86 = auVar100._14_2_;
                      uVar98 = (ushort)(sVar51 < sVar86) * sVar86 |
                               (ushort)(sVar51 >= sVar86) * sVar51;
                      auVar64._0_2_ =
                           ((short)uVar74 < (short)uVar87) * uVar87 |
                           ((short)uVar74 >= (short)uVar87) * uVar74;
                      auVar64._2_2_ =
                           ((short)uVar92 < (short)uVar71) * uVar71 |
                           ((short)uVar92 >= (short)uVar71) * uVar92;
                      auVar64._4_2_ =
                           ((short)uVar75 < (short)uVar88) * uVar88 |
                           ((short)uVar75 >= (short)uVar88) * uVar75;
                      auVar64._6_2_ =
                           ((short)uVar76 < (short)uVar89) * uVar89 |
                           ((short)uVar76 >= (short)uVar89) * uVar76;
                      auVar64._8_2_ =
                           ((short)uVar93 < (short)uVar72) * uVar72 |
                           ((short)uVar93 >= (short)uVar72) * uVar93;
                      auVar64._10_2_ =
                           ((short)uVar77 < (short)uVar90) * uVar90 |
                           ((short)uVar77 >= (short)uVar90) * uVar77;
                      auVar64._12_2_ =
                           ((short)uVar94 < (short)uVar73) * uVar73 |
                           ((short)uVar94 >= (short)uVar73) * uVar94;
                      auVar64._14_2_ =
                           ((short)uVar98 < (short)uVar91) * uVar91 |
                           ((short)uVar98 >= (short)uVar91) * uVar98;
                      if (uVar67 == 0) goto LAB_0068c532;
                      lVar35 = lVar35 + 0x10;
                    } while (lVar24 != lVar35);
                    iVar17 = 0;
LAB_0068c532:
                  } while ((iVar17 == 0) && (bVar40 = uVar15 < 7, uVar15 = uVar15 + 1, bVar40));
                  palVar20 = ptr_05 + uVar22;
                  sVar41 = (short)(*palVar20)[0];
                  sVar51 = *(short *)((long)*palVar20 + 2);
                  sVar52 = *(short *)((long)*palVar20 + 4);
                  sVar53 = *(short *)((long)*palVar20 + 6);
                  sVar54 = (short)(*palVar20)[1];
                  sVar56 = *(short *)((long)*palVar20 + 10);
                  sVar57 = *(short *)((long)*palVar20 + 0xc);
                  sVar58 = *(short *)((long)*palVar20 + 0xe);
                  local_98 = auVar46._0_2_;
                  sStack_96 = auVar46._2_2_;
                  sStack_94 = auVar46._4_2_;
                  sStack_92 = auVar46._6_2_;
                  sStack_90 = auVar46._8_2_;
                  sStack_8e = auVar46._10_2_;
                  sStack_8c = auVar46._12_2_;
                  sStack_8a = auVar46._14_2_;
                  auVar50._0_2_ = -(ushort)(local_98 < sVar41);
                  auVar50._2_2_ = -(ushort)(sStack_96 < sVar51);
                  auVar50._4_2_ = -(ushort)(sStack_94 < sVar52);
                  auVar50._6_2_ = -(ushort)(sStack_92 < sVar53);
                  auVar50._8_2_ = -(ushort)(sStack_90 < sVar54);
                  auVar50._10_2_ = -(ushort)(sStack_8e < sVar56);
                  auVar50._12_2_ = -(ushort)(sStack_8c < sVar57);
                  auVar50._14_2_ = -(ushort)(sStack_8a < sVar58);
                  auVar97 = pblendvb(auVar97,(undefined1  [16])b[uVar22],auVar50);
                  auVar70 = pblendvb(auVar70,(undefined1  [16])local_1e8[uVar22],auVar50);
                  auVar45 = pblendvb(auVar45,(undefined1  [16])local_1f0[uVar22],auVar50);
                  sVar86 = auVar45._14_2_;
                  auVar46._0_2_ =
                       (ushort)(sVar41 < local_98) * local_98 |
                       (ushort)(sVar41 >= local_98) * sVar41;
                  auVar46._2_2_ =
                       (ushort)(sVar51 < sStack_96) * sStack_96 |
                       (ushort)(sVar51 >= sStack_96) * sVar51;
                  auVar46._4_2_ =
                       (ushort)(sVar52 < sStack_94) * sStack_94 |
                       (ushort)(sVar52 >= sStack_94) * sVar52;
                  auVar46._6_2_ =
                       (ushort)(sVar53 < sStack_92) * sStack_92 |
                       (ushort)(sVar53 >= sStack_92) * sVar53;
                  auVar46._8_2_ =
                       (ushort)(sVar54 < sStack_90) * sStack_90 |
                       (ushort)(sVar54 >= sStack_90) * sVar54;
                  auVar46._10_2_ =
                       (ushort)(sVar56 < sStack_8e) * sStack_8e |
                       (ushort)(sVar56 >= sStack_8e) * sVar56;
                  auVar46._12_2_ =
                       (ushort)(sVar57 < sStack_8c) * sStack_8c |
                       (ushort)(sVar57 >= sStack_8c) * sVar57;
                  auVar46._14_2_ =
                       (ushort)(sVar58 < sStack_8a) * sStack_8a |
                       (ushort)(sVar58 >= sStack_8a) * sVar58;
                  auVar10._2_2_ = -(ushort)(sStack_116 == 6);
                  auVar10._0_2_ = -(ushort)(local_118 == 7);
                  auVar10._4_2_ = -(ushort)(local_118 == 5);
                  auVar10._6_2_ = -(ushort)(sStack_116 == 4);
                  auVar10._8_2_ = -(ushort)(local_118 == 3);
                  auVar10._10_2_ = -(ushort)(sStack_116 == 2);
                  auVar10._12_2_ = -(ushort)(local_118 == 1);
                  auVar10._14_2_ = -(ushort)(sStack_116 == 0);
                  auVar50 = auVar50 & auVar10;
                  if ((((((((((((((((auVar50 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar50 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar50 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar50 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar50 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar50 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar50 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar50 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar50 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar50 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar50 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar50 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar50 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar50[0xf] < '\0') {
                    iVar36 = (int)uVar31;
                  }
                  uVar31 = uVar31 + 1;
                  palVar20 = ptr_04;
                  palVar19 = ptr_05;
                  b_00 = local_1e8;
                  b_01 = local_1f0;
                  if (uVar31 == uVar32) {
                    if (s2_end == 0) {
                      sVar41 = 0;
                      sVar51 = 0;
                      sVar86 = 0;
                    }
                    else {
                      if (iVar13 < 7) {
                        auVar44 = auVar46;
                        uVar23 = 1;
                        if (1 < (int)uVar21) {
                          uVar23 = uVar21;
                        }
                        do {
                          auVar61._0_8_ = auVar44._0_8_ << 0x10;
                          auVar61._8_8_ = auVar44._8_8_ << 0x10 | auVar44._0_8_ >> 0x30;
                          auVar46._14_2_ = auVar44._12_2_;
                          lVar24 = auVar97._8_8_;
                          uVar32 = auVar97._0_8_;
                          auVar97._0_8_ = uVar32 << 0x10;
                          auVar97._8_8_ = lVar24 << 0x10 | uVar32 >> 0x30;
                          lVar24 = auVar70._8_8_;
                          uVar32 = auVar70._0_8_;
                          auVar70._0_8_ = uVar32 << 0x10;
                          auVar70._8_8_ = lVar24 << 0x10 | uVar32 >> 0x30;
                          auVar66._0_8_ = auVar45._0_8_ << 0x10;
                          auVar66._8_8_ = auVar45._8_8_ << 0x10 | auVar45._0_8_ >> 0x30;
                          sVar86 = auVar45._12_2_;
                          uVar23 = uVar23 - 1;
                          auVar44 = auVar61;
                          auVar45 = auVar66;
                        } while (uVar23 != 0);
                      }
                      local_220 = (uint)auVar46._14_2_;
                      sVar41 = (short)(auVar97._8_8_ >> 0x30);
                      sVar51 = (short)(auVar70._8_8_ >> 0x30);
                    }
                    iVar17 = iVar26;
                    if ((s1_end != 0) && (((ulong)uVar16 + 7 & 0x7ffffff8) != 0)) {
                      uVar32 = 0;
                      do {
                        iVar33 = ((uint)uVar32 & 7) * uVar38 + ((uint)(uVar32 >> 3) & 0x1fffffff);
                        if (iVar33 < (int)uVar16) {
                          auVar46._14_2_ = *(ushort *)((long)*ptr_05 + uVar32 * 2);
                          bVar40 = auVar46._14_2_ == (ushort)local_220;
                          iVar12 = iVar14;
                          uVar23 = (uint)auVar46._14_2_;
                          if (((short)(ushort)local_220 < (short)auVar46._14_2_) ||
                             (((bVar40 && (iVar36 == iVar14)) &&
                              (iVar12 = iVar36, uVar23 = local_220, iVar33 < iVar17)))) {
                            iVar36 = iVar12;
                            sVar41 = *(short *)((long)*b + uVar32 * 2);
                            sVar51 = *(short *)((long)*local_1e8 + uVar32 * 2);
                            sVar86 = *(short *)((long)*local_1f0 + uVar32 * 2);
                            iVar17 = iVar33;
                            local_220 = uVar23;
                          }
                        }
                        uVar32 = uVar32 + 1;
                      } while ((uVar38 & 0xfffffff) << 3 != (int)uVar32);
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      uVar32 = ptr_05[uVar22][0];
                      uVar39 = ptr_05[uVar22][1];
                      uVar31 = b[uVar22][0];
                      auVar70._8_8_ = b[uVar22][1];
                      auVar97._8_8_ = local_1e8[uVar22][0];
                      uVar62 = local_1e8[uVar22][1];
                      uVar30 = local_1f0[uVar22][0];
                      uVar55 = local_1f0[uVar22][1];
                      if (iVar13 < 7) {
                        uVar16 = 1;
                        if (1 < (int)uVar21) {
                          uVar16 = uVar21;
                        }
                        do {
                          uVar39 = uVar39 << 0x10 | uVar32 >> 0x30;
                          auVar70._8_8_ = auVar70._8_8_ << 0x10 | uVar31 >> 0x30;
                          uVar62 = uVar62 << 0x10 | auVar97._8_8_ >> 0x30;
                          uVar55 = uVar55 << 0x10 | uVar30 >> 0x30;
                          uVar16 = uVar16 - 1;
                          uVar32 = uVar32 << 0x10;
                          uVar31 = uVar31 << 0x10;
                          auVar97._8_8_ = auVar97._8_8_ << 0x10;
                          uVar30 = uVar30 << 0x10;
                        } while (uVar16 != 0);
                      }
                      local_220._0_2_ = (ushort)(uVar39 >> 0x30);
                      sVar41 = (short)(auVar70._8_8_ >> 0x30);
                      sVar51 = (short)(uVar62 >> 0x30);
                      sVar86 = (short)(uVar55 >> 0x30);
                      iVar36 = iVar14;
                      iVar17 = iVar26;
                    }
                    auVar44._0_2_ = -(ushort)((short)uVar78 < local_128);
                    auVar44._2_2_ = -(ushort)((short)uVar79 < sStack_126);
                    auVar44._4_2_ = -(ushort)((short)uVar80 < local_128);
                    auVar44._6_2_ = -(ushort)((short)uVar81 < sStack_126);
                    auVar44._8_2_ = -(ushort)((short)uVar82 < local_128);
                    auVar44._10_2_ = -(ushort)((short)uVar83 < sStack_126);
                    auVar44._12_2_ = -(ushort)((short)uVar84 < local_128);
                    auVar44._14_2_ = -(ushort)((short)uVar85 < sStack_126);
                    auVar45._0_2_ = -(ushort)((short)local_c8 < (short)auVar64._0_2_);
                    auVar45._2_2_ = -(ushort)((short)uStack_c6 < (short)auVar64._2_2_);
                    auVar45._4_2_ = -(ushort)((short)local_c8 < (short)auVar64._4_2_);
                    auVar45._6_2_ = -(ushort)((short)uStack_c6 < (short)auVar64._6_2_);
                    auVar45._8_2_ = -(ushort)((short)local_c8 < (short)auVar64._8_2_);
                    auVar45._10_2_ = -(ushort)((short)uStack_c6 < (short)auVar64._10_2_);
                    auVar45._12_2_ = -(ushort)((short)local_c8 < (short)auVar64._12_2_);
                    auVar45._14_2_ = -(ushort)((short)uStack_c6 < (short)auVar64._14_2_);
                    auVar45 = auVar45 | auVar44;
                    if ((((((((((((((((auVar45 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar45 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar45 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (auVar45 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar45 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar45 >> 0x2f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar45 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar45 >> 0x47 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar45 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar45 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar45 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar45 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar45 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar45[0xf] < '\0') {
                      *(byte *)&ppVar18->flag = (byte)ppVar18->flag | 0x40;
                      local_220._0_2_ = 0;
                      sVar41 = 0;
                      sVar51 = 0;
                      sVar86 = 0;
                      iVar36 = 0;
                      iVar17 = 0;
                    }
                    ppVar18->score = (int)(short)(ushort)local_220;
                    ppVar18->end_query = iVar17;
                    ppVar18->end_ref = iVar36;
                    *(int *)(ppVar18->field_4).extra = (int)sVar41;
                    ((ppVar18->field_4).stats)->similar = (int)sVar51;
                    ((ppVar18->field_4).stats)->length = (int)sVar86;
                    parasail_free(ptr_03);
                    parasail_free(b_04);
                    parasail_free(b_03);
                    parasail_free(b_02);
                    parasail_free(ptr_02);
                    parasail_free(ptr_01);
                    parasail_free(local_1f0);
                    parasail_free(ptr_00);
                    parasail_free(local_1e8);
                    parasail_free(ptr_04);
                    parasail_free(b);
                    parasail_free(ptr);
                    parasail_free(ptr_05);
                    return ppVar18;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHM;
    __m128i vMaxHS;
    __m128i vMaxHL;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile16.score;
    vProfileM = (__m128i*)profile->profile16.matches;
    vProfileS = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);
        vHM = _mm_slli_si128(vHM, 2);
        vHS = _mm_slli_si128(vHS, 2);
        vHL = _mm_slli_si128(vHL, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi16(vH, vH_dag);
            case2 = _mm_cmpeq_epi16(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_adds_epi16(vEL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vFL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 2);
            vF = _mm_slli_si128(vF, 2);
            vFM = _mm_slli_si128(vFM, 2);
            vFS = _mm_slli_si128(vFS, 2);
            vFL = _mm_slli_si128(vFL, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFL = _mm_insert_epi16(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi16(vH, vHp);
                case2 = _mm_cmpeq_epi16(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_adds_epi16(vFL, vOne),
                        _mm_adds_epi16(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            cond_max = _mm_cmpgt_epi16(vH, vMaxH);
            vMaxH = _mm_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
        result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
        result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
            vMaxHM = _mm_slli_si128(vMaxHM, 2);
            vMaxHS = _mm_slli_si128(vMaxHS, 2);
            vMaxHL = _mm_slli_si128(vMaxHL, 2);
        }
        end_query = s1Len-1;
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        matches = (int16_t) _mm_extract_epi16(vMaxHM, 7);
        similar = (int16_t) _mm_extract_epi16(vMaxHS, 7);
        length = (int16_t) _mm_extract_epi16(vMaxHL, 7);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvHStore;
        int16_t *m = (int16_t*)pvHMStore;
        int16_t *s = (int16_t*)pvHSStore;
        int16_t *l = (int16_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}